

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-reno.c
# Opt level: O3

void reno_on_acked(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t largest_acked,
                  uint32_t inflight,int64_t now,uint32_t max_udp_payload_size)

{
  uint uVar1;
  uint uVar2;
  
  if (bytes <= inflight) {
    if (cc->recovery_end <= largest_acked) {
      uVar1 = cc->cwnd;
      if (uVar1 < cc->ssthresh) {
        uVar1 = uVar1 + bytes;
        cc->cwnd = uVar1;
        if (cc->cwnd_maximum < uVar1) {
          cc->cwnd_maximum = uVar1;
        }
      }
      else {
        uVar2 = bytes + (cc->state).reno.stash;
        *(uint *)&cc->state = uVar2;
        if (uVar1 <= uVar2) {
          *(uint *)&cc->state = uVar2 % uVar1;
          uVar1 = (uVar2 / uVar1) * max_udp_payload_size + uVar1;
          cc->cwnd = uVar1;
          if (cc->cwnd_maximum < uVar1) {
            cc->cwnd_maximum = uVar1;
          }
        }
      }
    }
    return;
  }
  __assert_fail("inflight >= bytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/cc-reno.c"
                ,0x1d,
                "void reno_on_acked(quicly_cc_t *, const quicly_loss_t *, uint32_t, uint64_t, uint32_t, int64_t, uint32_t)"
               );
}

Assistant:

static void reno_on_acked(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t largest_acked, uint32_t inflight,
                          int64_t now, uint32_t max_udp_payload_size)
{
    assert(inflight >= bytes);
    /* Do not increase congestion window while in recovery. */
    if (largest_acked < cc->recovery_end)
        return;

    /* Slow start. */
    if (cc->cwnd < cc->ssthresh) {
        cc->cwnd += bytes;
        if (cc->cwnd_maximum < cc->cwnd)
            cc->cwnd_maximum = cc->cwnd;
        return;
    }
    /* Congestion avoidance. */
    cc->state.reno.stash += bytes;
    if (cc->state.reno.stash < cc->cwnd)
        return;
    /* Increase congestion window by 1 MSS per congestion window acked. */
    uint32_t count = cc->state.reno.stash / cc->cwnd;
    cc->state.reno.stash -= count * cc->cwnd;
    cc->cwnd += count * max_udp_payload_size;
    if (cc->cwnd_maximum < cc->cwnd)
        cc->cwnd_maximum = cc->cwnd;
}